

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void cpptempl::parse(ostream *stream,string *templ_text,data_map *data)

{
  long *plVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  token_vector tokens;
  token_vector tree;
  token_vector local_78;
  token_vector local_58;
  string local_40;
  
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)templ_text);
  tokenize(&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_tree(&local_78,&local_58,TOKEN_TYPE_NONE);
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)local_58.
                      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar2) break;
    plVar1 = *(long **)((long)&((local_58.
                                 super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar3);
    (**(code **)(*plVar1 + 8))(plVar1,stream,data);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x10;
  }
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(&local_58);
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

inline void parse(std::ostream &stream, std::string templ_text, data_map &data)
    {
        token_vector tokens ;
        tokenize(templ_text, tokens) ;
        token_vector tree ;
        parse_tree(tokens, tree) ;

        for (size_t i = 0 ; i < tree.size() ; ++i)
        {
            // Recursively calls gettext on each node in the tree.
            // gettext returns the appropriate text for that node.
            // for text, itself;
            // for variable, substitution;
            // for control statement, recursively gets kids
            tree[i]->gettext(stream, data) ;
        }
    }